

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int mem_av_trans_func(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t dst;
  MIR_insn_t pMVar1;
  size_t nb;
  uint uVar2;
  int iVar3;
  mem_expr_t pmVar4;
  MIR_insn_t mem1;
  size_t nel2;
  size_t nel;
  bitmap_iterator_t bi2;
  bitmap_iterator_t bi;
  size_t local_60;
  size_t local_58;
  bitmap_iterator_t local_50;
  bitmap_iterator_t local_40;
  
  dst = gen_ctx->temp_bitmap;
  bitmap_copy(dst,bb->out);
  bitmap_copy(bb->out,bb->gen);
  if (bb->call_p == '\0') {
    local_40.bitmap = bb->in;
    local_40.nbit = 0;
LAB_0013cf35:
    iVar3 = bitmap_iterator_next(&local_40,&local_58);
    nb = local_58;
    if (iVar3 != 0) {
      pmVar4 = VARR_mem_expr_tget(gen_ctx->gvn_ctx->mem_exprs,local_58);
      pMVar1 = pmVar4->insn;
      local_50.bitmap = bb->gen;
      mem1 = pMVar1 + 1;
      if (pMVar1->ops[0].field_0x8 == '\v') {
        mem1 = (MIR_insn_t)pMVar1->ops;
      }
      local_50.nbit = 0;
      do {
        iVar3 = bitmap_iterator_next(&local_50,&local_60);
        if (iVar3 == 0) {
          bitmap_set_bit_p(bb->out,nb);
          break;
        }
        pmVar4 = VARR_mem_expr_tget(gen_ctx->gvn_ctx->mem_exprs,local_60);
      } while ((pmVar4->insn->ops[0].field_0x8 != '\v') ||
              (iVar3 = may_mem_alias_p((MIR_op_t *)mem1,pmVar4->insn->ops), iVar3 == 0));
      goto LAB_0013cf35;
    }
  }
  uVar2 = bitmap_equal_p(bb->out,dst);
  return uVar2 ^ 1;
}

Assistant:

static int mem_av_trans_func (gen_ctx_t gen_ctx, bb_t bb) {
  int alias_p;
  size_t nel, nel2;
  MIR_insn_t insn, mem_insn;
  MIR_op_t *mem_ref;
  bitmap_iterator_t bi, bi2;
  bitmap_t prev_mem_av_out = temp_bitmap;

  bitmap_copy (prev_mem_av_out, bb->mem_av_out);
  bitmap_copy (bb->mem_av_out, bb->gen);
  if (!bb->call_p) {
    FOREACH_BITMAP_BIT (bi, bb->mem_av_in, nel) {
      alias_p = FALSE;
      insn = VARR_GET (mem_expr_t, mem_exprs, nel)->insn;
      mem_ref = insn->ops[0].mode == MIR_OP_VAR_MEM ? &insn->ops[0] : &insn->ops[1];
      FOREACH_BITMAP_BIT (bi2, bb->gen, nel2) { /* consider only stores */
        mem_insn = VARR_GET (mem_expr_t, mem_exprs, nel2)->insn;
        if (mem_insn->ops[0].mode == MIR_OP_VAR_MEM
            && may_mem_alias_p (mem_ref, &mem_insn->ops[0])) {
          alias_p = TRUE;
          break;
        }
      }
      if (!alias_p) bitmap_set_bit_p (bb->mem_av_out, nel);
    }
  }
  return !bitmap_equal_p (bb->mem_av_out, prev_mem_av_out);
}